

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O3

int r1fgkb_(int *ido,int *ip,int *l1,int *idl1,double *cc,double *c1,double *c2,int *in1,double *ch,
           double *ch2,int *in2,double *wa)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  double *pdVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  double *pdVar23;
  double *pdVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  double *pdVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  long lVar36;
  double *pdVar37;
  long lVar38;
  double *pdVar39;
  double *pdVar40;
  long lVar41;
  int iVar42;
  ulong uVar43;
  int iVar44;
  ulong uVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  long lVar49;
  double *pdVar50;
  long lVar51;
  long lVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  long local_1b0;
  double *local_1a8;
  double *local_1a0;
  double *local_190;
  double *local_188;
  double *local_180;
  double *local_178;
  double *local_170;
  double *local_168;
  double *local_148;
  double *local_140;
  double *local_120;
  double *local_f0;
  double *local_e8;
  double *local_e0;
  int local_a8;
  int local_a4;
  double *local_a0;
  double *local_60;
  double *local_58;
  double *local_50;
  
  iVar1 = *in1;
  lVar29 = (long)iVar1;
  iVar28 = *idl1;
  lVar11 = (long)iVar28;
  iVar2 = *ido;
  lVar36 = (long)iVar2;
  iVar3 = *l1;
  lVar12 = (long)iVar3;
  iVar8 = (iVar3 + 1) * iVar2 + 1;
  iVar42 = *ip;
  lVar38 = (long)iVar42;
  lVar19 = (long)(~((iVar42 + 1) * iVar2) * iVar1 + -1);
  iVar4 = *in2;
  lVar20 = (long)iVar4;
  lVar13 = (long)~(iVar8 * iVar4);
  dVar53 = cos(6.283185307179586 / (double)iVar42);
  dVar54 = sin(6.283185307179586 / (double)iVar42);
  uVar5 = *ido;
  lVar21 = (long)(int)uVar5;
  uVar6 = *ip;
  uVar7 = *l1;
  if ((int)uVar5 < (int)uVar7) {
    if (0 < (int)uVar5) {
      pdVar37 = ch + ((lVar12 + 1) * lVar36 + 1) * lVar20 + lVar13 + 1;
      pdVar32 = cc + ((lVar38 + 1) * lVar36 + 1) * lVar29 + lVar19 + 1;
      lVar22 = (ulong)(uVar7 + 1) - 1;
      lVar30 = 1;
      lVar49 = lVar22;
      pdVar17 = pdVar37;
      pdVar23 = pdVar32;
      do {
        do {
          *pdVar37 = *pdVar32;
          pdVar37 = pdVar37 + lVar36 * lVar20;
          pdVar32 = pdVar32 + lVar38 * lVar36 * lVar29;
          lVar49 = lVar49 + -1;
        } while (lVar49 != 0);
        lVar30 = lVar30 + 1;
        pdVar37 = pdVar17 + lVar20;
        pdVar32 = pdVar23 + lVar29;
        lVar49 = lVar22;
        pdVar17 = pdVar37;
        pdVar23 = pdVar32;
      } while (lVar30 != (ulong)uVar5 + 1);
    }
  }
  else if (0 < (int)uVar7) {
    pdVar32 = ch + ((lVar12 + 1) * lVar36 + 1) * lVar20 + lVar13 + 1;
    pdVar37 = cc + ((lVar38 + 1) * lVar36 + 1) * lVar29 + lVar19 + 1;
    lVar22 = (ulong)(uVar5 + 1) - 1;
    lVar30 = 1;
    lVar49 = lVar22;
    pdVar17 = pdVar37;
    pdVar23 = pdVar32;
    do {
      do {
        *pdVar32 = *pdVar37;
        pdVar32 = pdVar32 + lVar20;
        pdVar37 = pdVar37 + lVar29;
        lVar49 = lVar49 + -1;
      } while (lVar49 != 0);
      lVar30 = lVar30 + 1;
      pdVar32 = pdVar23 + lVar36 * lVar20;
      pdVar37 = pdVar17 + lVar38 * lVar36 * lVar29;
      lVar49 = lVar22;
      pdVar17 = pdVar37;
      pdVar23 = pdVar32;
    } while (lVar30 != (ulong)uVar7 + 1);
  }
  uVar18 = uVar6 + 2;
  iVar33 = (int)((uVar6 - ((int)(uVar6 + 1) >> 0x1f)) + 1) >> 1;
  if (2 < (int)uVar6) {
    iVar10 = 2;
    if (2 < iVar33) {
      iVar10 = iVar33;
    }
    pdVar17 = ch + ((((ulong)uVar18 - 2) * lVar12 + 1) * lVar36 + 1) * lVar20 + 1;
    lVar49 = lVar36 * lVar20;
    pdVar23 = ch + ((lVar12 * 2 + 1) * lVar36 + 1) * lVar20 + 1;
    lVar22 = lVar19 * 8 + ((lVar38 + 3) * lVar36 + 1) * lVar29 * 8 + 8;
    lVar30 = lVar36 * lVar29 * 0x10;
    lVar52 = lVar19 * 8 + ((lVar38 + 2) * lVar36 + lVar21) * lVar29 * 8 + 8;
    uVar45 = 2;
    do {
      lVar14 = (ulong)(uVar7 + 1) - 1;
      pdVar32 = pdVar23;
      pdVar37 = pdVar17;
      pdVar39 = cc;
      if (0 < (int)uVar7) {
        do {
          pdVar32[lVar13] =
               *(double *)((long)pdVar39 + lVar52) + *(double *)((long)pdVar39 + lVar52);
          pdVar37[lVar13] =
               *(double *)((long)pdVar39 + lVar22) + *(double *)((long)pdVar39 + lVar22);
          lVar14 = lVar14 + -1;
          pdVar32 = pdVar32 + lVar49;
          pdVar37 = pdVar37 + lVar49;
          pdVar39 = pdVar39 + lVar36 * lVar29 * lVar38;
        } while (lVar14 != 0);
      }
      uVar45 = uVar45 + 1;
      pdVar17 = pdVar17 + -(lVar49 * lVar12);
      pdVar23 = pdVar23 + lVar49 * lVar12;
      lVar22 = lVar22 + lVar30;
      lVar52 = lVar52 + lVar30;
    } while (uVar45 != iVar10 + 1);
  }
  lVar38 = (long)~(iVar8 * iVar1);
  lVar49 = (long)~((iVar28 + 1) * iVar4);
  lVar22 = (long)~((iVar28 + 1) * iVar1);
  iVar8 = (int)((uVar5 - ((int)(uVar5 - 1) >> 0x1f)) + -1) >> 1;
  if (uVar5 != 1) {
    pdVar17 = cc + lVar19;
    if (iVar8 < (int)uVar7) {
      if ((int)uVar6 < 3) goto LAB_0012cbed;
      iVar10 = 2;
      if (2 < iVar33) {
        iVar10 = iVar33;
      }
      iVar46 = (iVar42 + 2) * iVar2;
      iVar48 = (uVar5 + iVar46 + -2) * iVar1;
      iVar35 = iVar1 * iVar2 * 2;
      iVar46 = (iVar46 + uVar5 + -1) * iVar1;
      iVar9 = (iVar42 + 3) * iVar2;
      iVar25 = (iVar9 + 3) * iVar1;
      iVar9 = (iVar9 + 2) * iVar1;
      lVar19 = (((ulong)uVar18 - 2) * lVar12 + 1) * lVar36;
      local_120 = ch + (lVar19 + 3) * lVar20 + lVar13 + 1;
      lVar30 = lVar36 * lVar20 * lVar12;
      lVar52 = (lVar12 * 2 + 1) * lVar36;
      local_f0 = ch + (lVar19 + 2) * lVar20 + lVar13 + 1;
      local_e0 = ch + (lVar52 + 3) * lVar20 + lVar13 + 1;
      local_e8 = ch + (lVar52 + 2) * lVar20 + lVar13 + 1;
      uVar45 = 2;
      do {
        if (2 < (int)uVar5) {
          lVar19 = 3;
          pdVar23 = local_e0;
          pdVar32 = local_e8;
          pdVar37 = local_120;
          pdVar39 = local_f0;
          iVar27 = iVar46;
          iVar47 = iVar25;
          iVar34 = iVar48;
          iVar44 = iVar9;
          do {
            if (0 < (int)uVar7) {
              lVar14 = 0;
              iVar26 = 0;
              lVar52 = (ulong)(uVar7 + 1) - 1;
              do {
                *(double *)((long)pdVar32 + lVar14) =
                     pdVar17[(long)(iVar44 + iVar26) + 1] + pdVar17[(long)(iVar34 + iVar26) + 1];
                *(double *)((long)pdVar39 + lVar14) =
                     pdVar17[(long)(iVar44 + iVar26) + 1] - pdVar17[(long)(iVar34 + iVar26) + 1];
                *(double *)((long)pdVar23 + lVar14) =
                     pdVar17[(long)(iVar47 + iVar26) + 1] - pdVar17[(long)(iVar27 + iVar26) + 1];
                *(double *)((long)pdVar37 + lVar14) =
                     pdVar17[(long)(iVar47 + iVar26) + 1] + pdVar17[(long)(iVar27 + iVar26) + 1];
                iVar26 = iVar26 + iVar1 * iVar42 * iVar2;
                lVar14 = lVar14 + lVar36 * lVar20 * 8;
                lVar52 = lVar52 + -1;
              } while (lVar52 != 0);
            }
            lVar19 = lVar19 + 2;
            iVar34 = iVar34 + iVar1 * -2;
            iVar27 = iVar27 + iVar1 * -2;
            iVar47 = iVar47 + iVar1 * 2;
            iVar44 = iVar44 + iVar1 * 2;
            pdVar37 = pdVar37 + lVar20 * 2;
            pdVar39 = pdVar39 + lVar20 * 2;
            pdVar23 = pdVar23 + lVar20 * 2;
            pdVar32 = pdVar32 + lVar20 * 2;
          } while (lVar19 <= lVar21);
        }
        uVar45 = uVar45 + 1;
        iVar48 = iVar48 + iVar35;
        iVar46 = iVar46 + iVar35;
        iVar25 = iVar25 + iVar35;
        iVar9 = iVar9 + iVar35;
        local_120 = local_120 + -lVar30;
        local_f0 = local_f0 + -lVar30;
        local_e0 = local_e0 + lVar30;
        local_e8 = local_e8 + lVar30;
      } while (uVar45 != iVar10 + 1);
    }
    else {
      if ((int)uVar6 < 3) goto LAB_0012cbed;
      iVar10 = 2;
      if (2 < iVar33) {
        iVar10 = iVar33;
      }
      lVar14 = (((ulong)uVar18 - 2) * lVar12 + 1) * lVar36;
      local_a0 = ch + (lVar14 + 3) * lVar20 + lVar13 + 1;
      lVar52 = lVar36 * lVar20;
      lVar41 = lVar52 * lVar12;
      lVar30 = (lVar12 * 2 + 1) * lVar36;
      local_50 = ch + (lVar30 + 3) * lVar20 + lVar13 + 1;
      local_a4 = (iVar42 + 3) * iVar2;
      iVar48 = (iVar42 + 2) * iVar2;
      local_a8 = (iVar48 + uVar5 + -2) * iVar1;
      local_58 = ch + (lVar30 + 2) * lVar20 + lVar13 + 1;
      local_60 = ch + (lVar14 + 2) * lVar20 + lVar13 + 1;
      lVar30 = lVar29 * 8;
      uVar45 = 2;
      do {
        if (0 < (int)uVar7) {
          uVar15 = 1;
          pdVar23 = local_58;
          pdVar32 = local_a0;
          pdVar37 = local_60;
          pdVar39 = local_50;
          iVar35 = local_a8;
          iVar46 = local_a4;
          iVar25 = iVar48;
          do {
            if (2 < (int)uVar5) {
              lVar14 = ((long)iVar46 + 3) * lVar30;
              pdVar24 = (double *)
                        ((long)cc +
                        ((long)iVar25 + (long)(int)(uVar5 + 2) + -3) * lVar30 + lVar19 * 8 + 8);
              lVar31 = ((long)iVar46 + 2) * lVar30;
              lVar16 = 3;
              lVar51 = 0;
              pdVar40 = pdVar17;
              iVar9 = iVar35;
              do {
                *(double *)((long)pdVar23 + lVar51) =
                     *(double *)((long)pdVar40 + lVar31 + 8) + pdVar17[(long)iVar9 + 1];
                *(double *)((long)pdVar37 + lVar51) =
                     *(double *)((long)pdVar40 + lVar31 + 8) - pdVar17[(long)iVar9 + 1];
                *(double *)((long)pdVar39 + lVar51) =
                     *(double *)((long)pdVar40 + lVar14 + 8) - *pdVar24;
                *(double *)((long)pdVar32 + lVar51) =
                     *(double *)((long)pdVar40 + lVar14 + 8) + *pdVar24;
                lVar16 = lVar16 + 2;
                lVar51 = lVar51 + lVar20 * 0x10;
                pdVar40 = pdVar40 + lVar29 * 2;
                iVar9 = iVar9 + iVar1 * -2;
                pdVar24 = pdVar24 + lVar29 * -2;
              } while (lVar16 <= lVar21);
            }
            uVar15 = uVar15 + 1;
            pdVar32 = pdVar32 + lVar52;
            pdVar39 = pdVar39 + lVar52;
            iVar46 = iVar46 + iVar42 * iVar2;
            iVar35 = iVar35 + iVar1 * iVar42 * iVar2;
            iVar25 = iVar25 + iVar42 * iVar2;
            pdVar23 = pdVar23 + lVar52;
            pdVar37 = pdVar37 + lVar52;
          } while (uVar15 != uVar7 + 1);
        }
        uVar45 = uVar45 + 1;
        local_a0 = local_a0 + -lVar41;
        local_50 = local_50 + lVar41;
        local_a4 = local_a4 + iVar2 * 2;
        local_a8 = local_a8 + iVar1 * iVar2 * 2;
        iVar48 = iVar48 + iVar2 * 2;
        local_58 = local_58 + lVar41;
        local_60 = local_60 + -lVar41;
      } while (uVar45 != iVar10 + 1);
    }
  }
  if (2 < (int)uVar6) {
    iVar42 = *idl1;
    iVar10 = 3;
    if (3 < iVar33) {
      iVar10 = iVar33;
    }
    uVar45 = (ulong)uVar18;
    iVar48 = 2;
    if (2 < iVar33) {
      iVar48 = iVar33;
    }
    pdVar23 = c2 + ((uVar45 - 2) * lVar11 + 1) * lVar29 + lVar22;
    lVar19 = lVar11 * 2 + 1;
    pdVar17 = c2 + lVar19 * lVar29 + lVar22;
    lVar52 = (lVar11 + 1) * lVar20;
    lVar14 = (ulong)(iVar42 + 1) - 1;
    lVar30 = lVar11 * lVar20;
    dVar55 = 0.0;
    dVar57 = 1.0;
    uVar15 = 2;
    do {
      dVar56 = dVar55 * -dVar54;
      dVar55 = dVar57 * dVar54 + dVar53 * dVar55;
      dVar57 = dVar56 + dVar53 * dVar57;
      if (0 < iVar42) {
        lVar16 = 8;
        pdVar32 = ch2 + ((long)(int)(uVar6 * iVar28) + 1) * lVar20 + 1;
        lVar41 = lVar14;
        pdVar37 = ch2 + lVar52 + 1;
        pdVar39 = ch2 + ((long)(iVar28 * 2) + 1) * lVar20 + 1;
        do {
          *(double *)((long)pdVar17 + lVar16) = pdVar39[lVar49] * dVar57 + pdVar37[lVar49];
          *(double *)((long)pdVar23 + lVar16) = pdVar32[lVar49] * dVar55;
          lVar16 = lVar16 + lVar29 * 8;
          pdVar32 = pdVar32 + lVar20;
          pdVar39 = pdVar39 + lVar20;
          pdVar37 = pdVar37 + lVar20;
          lVar41 = lVar41 + -1;
        } while (lVar41 != 0);
      }
      if (4 < uVar6) {
        uVar43 = 3;
        pdVar32 = ch2 + ((uVar45 - 3) * lVar11 + 1) * lVar20 + lVar49;
        pdVar37 = ch2 + (lVar11 * 3 + 1) * lVar20 + lVar49;
        dVar56 = dVar55;
        dVar59 = dVar57;
        do {
          dVar58 = dVar56 * -dVar55;
          dVar56 = dVar59 * dVar55 + dVar57 * dVar56;
          dVar59 = dVar58 + dVar57 * dVar59;
          if (0 < iVar42) {
            lVar16 = 8;
            lVar31 = 8;
            lVar41 = lVar14;
            do {
              *(double *)((long)pdVar17 + lVar31) =
                   *(double *)((long)pdVar37 + lVar16) * dVar59 +
                   *(double *)((long)pdVar17 + lVar31);
              *(double *)((long)pdVar23 + lVar31) =
                   *(double *)((long)pdVar32 + lVar16) * dVar56 +
                   *(double *)((long)pdVar23 + lVar31);
              lVar31 = lVar31 + lVar29 * 8;
              lVar16 = lVar16 + lVar20 * 8;
              lVar41 = lVar41 + -1;
            } while (lVar41 != 0);
          }
          uVar43 = uVar43 + 1;
          pdVar32 = pdVar32 + -lVar30;
          pdVar37 = pdVar37 + lVar30;
        } while (uVar43 != iVar10 + 1);
      }
      uVar15 = uVar15 + 1;
      pdVar23 = pdVar23 + -(lVar11 * lVar29);
      pdVar17 = pdVar17 + lVar11 * lVar29;
    } while (uVar15 != iVar48 + 1);
    if (2 < (int)uVar6) {
      iVar28 = *idl1;
      iVar42 = 2;
      if (2 < iVar33) {
        iVar42 = iVar33;
      }
      lVar19 = lVar19 * lVar20 * 8 + 8;
      uVar15 = 2;
      do {
        lVar14 = (ulong)(iVar28 + 1) - 1;
        pdVar17 = ch2 + lVar49;
        if (0 < iVar28) {
          do {
            pdVar17[lVar52 + 1] = *(double *)((long)pdVar17 + lVar19) + pdVar17[lVar52 + 1];
            lVar14 = lVar14 + -1;
            pdVar17 = pdVar17 + lVar20;
          } while (lVar14 != 0);
        }
        uVar15 = uVar15 + 1;
        lVar19 = lVar19 + lVar30 * 8;
      } while (uVar15 != iVar42 + 1);
      if (2 < (int)uVar6) {
        iVar28 = 2;
        if (2 < iVar33) {
          iVar28 = iVar33;
        }
        lVar19 = ((uVar45 - 2) * lVar12 + 1) * lVar36 + 1;
        pdVar17 = ch + lVar19 * lVar20 + lVar13;
        lVar30 = lVar12 * lVar36 * lVar20;
        pdVar23 = c1 + lVar19 * lVar29 + lVar38;
        lVar19 = lVar12 * lVar36 * lVar29;
        lVar52 = (lVar12 * 2 + 1) * lVar36 + 1;
        pdVar37 = ch + lVar52 * lVar20 + lVar13;
        pdVar32 = c1 + lVar52 * lVar29 + lVar38;
        uVar45 = 2;
        do {
          if (0 < (int)uVar7) {
            lVar14 = 8;
            lVar41 = 8;
            lVar52 = (ulong)(uVar7 + 1) - 1;
            do {
              *(double *)((long)pdVar37 + lVar41) =
                   *(double *)((long)pdVar32 + lVar14) - *(double *)((long)pdVar23 + lVar14);
              *(double *)((long)pdVar17 + lVar41) =
                   *(double *)((long)pdVar32 + lVar14) + *(double *)((long)pdVar23 + lVar14);
              lVar41 = lVar41 + lVar36 * lVar20 * 8;
              lVar14 = lVar14 + lVar36 * lVar29 * 8;
              lVar52 = lVar52 + -1;
            } while (lVar52 != 0);
          }
          uVar45 = uVar45 + 1;
          pdVar17 = pdVar17 + -lVar30;
          pdVar23 = pdVar23 + -lVar19;
          pdVar37 = pdVar37 + lVar30;
          pdVar32 = pdVar32 + lVar19;
        } while (uVar45 != iVar28 + 1);
      }
    }
  }
  if (uVar5 == 1) {
    return 0;
  }
  if (iVar8 < (int)uVar7) {
    if (2 < (int)uVar6) {
      iVar28 = 2;
      if (2 < iVar33) {
        iVar28 = iVar33;
      }
      lVar14 = (((ulong)uVar18 - 2) * lVar12 + 1) * lVar36;
      lVar19 = lVar14 + 2;
      local_1a0 = c1 + lVar19 * lVar29 + lVar38 + 1;
      lVar52 = lVar12 * lVar36 * lVar29;
      lVar14 = lVar14 + 3;
      lVar41 = (lVar12 * 2 + 1) * lVar36;
      lVar30 = lVar41 + 3;
      lVar41 = lVar41 + 2;
      local_180 = ch + lVar19 * lVar20 + lVar13 + 1;
      lVar19 = lVar12 * lVar36 * lVar20;
      local_188 = ch + lVar14 * lVar20 + lVar13 + 1;
      local_168 = c1 + lVar14 * lVar29 + lVar38 + 1;
      local_170 = ch + lVar30 * lVar20 + lVar13 + 1;
      local_190 = c1 + lVar30 * lVar29 + lVar38 + 1;
      local_140 = ch + lVar41 * lVar20 + lVar13 + 1;
      local_148 = c1 + lVar41 * lVar29 + lVar38 + 1;
      uVar45 = 2;
      do {
        if (2 < (int)uVar5) {
          lVar30 = 3;
          pdVar17 = local_190;
          pdVar23 = local_1a0;
          pdVar32 = local_188;
          pdVar37 = local_168;
          pdVar39 = local_140;
          pdVar40 = local_170;
          pdVar24 = local_148;
          pdVar50 = local_180;
          do {
            if (0 < (int)uVar7) {
              lVar41 = 0;
              lVar16 = 0;
              lVar14 = (ulong)(uVar7 + 1) - 1;
              do {
                *(double *)((long)pdVar39 + lVar41) =
                     *(double *)((long)pdVar24 + lVar16) - *(double *)((long)pdVar37 + lVar16);
                *(double *)((long)pdVar50 + lVar41) =
                     *(double *)((long)pdVar24 + lVar16) + *(double *)((long)pdVar37 + lVar16);
                *(double *)((long)pdVar40 + lVar41) =
                     *(double *)((long)pdVar17 + lVar16) + *(double *)((long)pdVar23 + lVar16);
                *(double *)((long)pdVar32 + lVar41) =
                     *(double *)((long)pdVar17 + lVar16) - *(double *)((long)pdVar23 + lVar16);
                lVar16 = lVar16 + lVar36 * lVar29 * 8;
                lVar41 = lVar41 + lVar36 * lVar20 * 8;
                lVar14 = lVar14 + -1;
              } while (lVar14 != 0);
            }
            lVar30 = lVar30 + 2;
            pdVar23 = pdVar23 + lVar29 * 2;
            pdVar50 = pdVar50 + lVar20 * 2;
            pdVar32 = pdVar32 + lVar20 * 2;
            pdVar37 = pdVar37 + lVar29 * 2;
            pdVar40 = pdVar40 + lVar20 * 2;
            pdVar17 = pdVar17 + lVar29 * 2;
            pdVar39 = pdVar39 + lVar20 * 2;
            pdVar24 = pdVar24 + lVar29 * 2;
          } while (lVar30 <= lVar21);
        }
        uVar45 = uVar45 + 1;
        local_1a0 = local_1a0 + -lVar52;
        local_180 = local_180 + -lVar19;
        local_188 = local_188 + -lVar19;
        local_168 = local_168 + -lVar52;
        local_170 = local_170 + lVar19;
        local_190 = local_190 + lVar52;
        local_140 = local_140 + lVar19;
        local_148 = local_148 + lVar52;
      } while (uVar45 != iVar28 + 1);
    }
  }
  else if (2 < (int)uVar6) {
    iVar28 = 2;
    if (2 < iVar33) {
      iVar28 = iVar33;
    }
    lVar52 = (lVar12 * 2 + 1) * lVar36;
    lVar19 = lVar52 + 3;
    local_180 = ch + lVar19 * lVar20 + lVar13 + 1;
    lVar16 = lVar12 * lVar36 * lVar20;
    lVar30 = lVar36 * lVar20;
    local_188 = c1 + lVar19 * lVar29 + lVar38 + 1;
    lVar14 = lVar12 * lVar36 * lVar29;
    lVar41 = (((ulong)uVar18 - 2) * lVar12 + 1) * lVar36;
    lVar19 = lVar41 + 3;
    lVar52 = lVar52 + 2;
    lVar41 = lVar41 + 2;
    lVar31 = lVar36 * lVar29;
    local_168 = ch + lVar19 * lVar20 + lVar13 + 1;
    local_170 = c1 + lVar19 * lVar29 + lVar38 + 1;
    local_190 = ch + lVar52 * lVar20 + lVar13 + 1;
    local_140 = c1 + lVar52 * lVar29 + lVar38 + 1;
    local_148 = c1 + lVar41 * lVar29 + lVar38 + 1;
    local_1a8 = ch + lVar41 * lVar20 + lVar13 + 1;
    uVar45 = 2;
    do {
      if (0 < (int)uVar7) {
        uVar15 = 1;
        pdVar17 = local_170;
        pdVar23 = local_190;
        pdVar32 = local_188;
        pdVar37 = local_140;
        pdVar39 = local_1a8;
        pdVar40 = local_148;
        pdVar24 = local_180;
        pdVar50 = local_168;
        do {
          if (2 < (int)uVar5) {
            lVar19 = 3;
            lVar41 = 0;
            lVar52 = 0;
            do {
              *(double *)((long)pdVar23 + lVar52) =
                   *(double *)((long)pdVar37 + lVar41) - *(double *)((long)pdVar17 + lVar41);
              *(double *)((long)pdVar39 + lVar52) =
                   *(double *)((long)pdVar37 + lVar41) + *(double *)((long)pdVar17 + lVar41);
              *(double *)((long)pdVar24 + lVar52) =
                   *(double *)((long)pdVar32 + lVar41) + *(double *)((long)pdVar40 + lVar41);
              *(double *)((long)pdVar50 + lVar52) =
                   *(double *)((long)pdVar32 + lVar41) - *(double *)((long)pdVar40 + lVar41);
              lVar19 = lVar19 + 2;
              lVar52 = lVar52 + lVar20 * 0x10;
              lVar41 = lVar41 + lVar29 * 0x10;
            } while (lVar19 <= lVar21);
          }
          uVar15 = uVar15 + 1;
          pdVar24 = pdVar24 + lVar30;
          pdVar32 = pdVar32 + lVar31;
          pdVar50 = pdVar50 + lVar30;
          pdVar17 = pdVar17 + lVar31;
          pdVar23 = pdVar23 + lVar30;
          pdVar37 = pdVar37 + lVar31;
          pdVar40 = pdVar40 + lVar31;
          pdVar39 = pdVar39 + lVar30;
        } while (uVar15 != uVar7 + 1);
      }
      uVar45 = uVar45 + 1;
      local_180 = local_180 + lVar16;
      local_188 = local_188 + lVar14;
      local_168 = local_168 + -lVar16;
      local_170 = local_170 + -lVar14;
      local_190 = local_190 + lVar16;
      local_140 = local_140 + lVar14;
      local_148 = local_148 + -lVar14;
      local_1a8 = local_1a8 + -lVar16;
    } while (uVar45 != iVar28 + 1);
  }
LAB_0012cbed:
  uVar45 = (ulong)(uint)*idl1;
  if (0 < *idl1) {
    pdVar17 = c2 + (lVar11 + 1) * lVar29 + lVar22 + 1;
    pdVar23 = ch2 + (lVar11 + 1) * lVar20 + lVar49 + 1;
    do {
      *pdVar17 = *pdVar23;
      pdVar17 = pdVar17 + lVar29;
      pdVar23 = pdVar23 + lVar20;
      uVar45 = uVar45 - 1;
    } while (uVar45 != 0);
  }
  if (1 < (int)uVar6) {
    uVar15 = (ulong)(uVar6 + 1);
    lVar11 = (lVar12 * 2 + 1) * lVar36;
    pdVar23 = c1 + lVar38 + (lVar11 + 1) * lVar29 + 1;
    lVar49 = lVar12 * lVar36 * lVar29;
    lVar19 = lVar36 * lVar29;
    pdVar17 = ch + (lVar11 + 1) * lVar20 + lVar13 + 1;
    lVar12 = lVar12 * lVar36 * lVar20;
    lVar36 = lVar36 * lVar20;
    uVar45 = 2;
    do {
      pdVar32 = pdVar23;
      lVar22 = (ulong)(uVar7 + 1) - 1;
      pdVar37 = pdVar17;
      if (0 < (int)uVar7) {
        do {
          *pdVar32 = *pdVar37;
          lVar22 = lVar22 + -1;
          pdVar32 = pdVar32 + lVar19;
          pdVar37 = pdVar37 + lVar36;
        } while (lVar22 != 0);
      }
      uVar45 = uVar45 + 1;
      pdVar23 = pdVar23 + lVar49;
      pdVar17 = pdVar17 + lVar12;
    } while (uVar45 != uVar15);
    if ((int)uVar7 < iVar8) {
      if (1 < (int)uVar6) {
        local_140 = c1 + (lVar11 + 3) * lVar29 + lVar38 + 1;
        local_148 = ch + (lVar11 + 3) * lVar20 + lVar13 + 1;
        iVar42 = (iVar3 * 2 + 1) * iVar2 + 2;
        iVar28 = iVar1 * iVar42;
        iVar42 = iVar42 * iVar4;
        iVar8 = 0;
        uVar45 = 2;
        do {
          if (0 < (int)uVar7) {
            uVar43 = 1;
            local_178 = local_148;
            local_1a0 = local_140;
            iVar33 = iVar28;
            iVar10 = iVar42;
            do {
              if (2 < (int)uVar5) {
                lVar11 = 3;
                pdVar17 = local_1a0;
                pdVar23 = local_178;
                iVar48 = iVar10;
                iVar46 = iVar33;
                do {
                  c1[lVar38 + (long)iVar46 + 1] =
                       wa[(long)iVar8 + lVar11 + -3] * ch[lVar13 + (long)iVar48 + 1] -
                       *pdVar23 * wa[(long)iVar8 + lVar11 + -2];
                  *pdVar17 = wa[(long)iVar8 + lVar11 + -3] * *pdVar23 +
                             wa[(long)iVar8 + lVar11 + -2] * ch[lVar13 + (long)iVar48 + 1];
                  lVar11 = lVar11 + 2;
                  pdVar17 = pdVar17 + lVar29 * 2;
                  pdVar23 = pdVar23 + lVar20 * 2;
                  iVar46 = iVar46 + iVar1 * 2;
                  iVar48 = iVar48 + iVar4 * 2;
                } while (lVar11 <= lVar21);
              }
              uVar43 = uVar43 + 1;
              local_1a0 = local_1a0 + lVar19;
              local_178 = local_178 + lVar36;
              iVar33 = iVar33 + iVar1 * iVar2;
              iVar10 = iVar10 + iVar2 * iVar4;
            } while (uVar43 != uVar7 + 1);
          }
          uVar45 = uVar45 + 1;
          iVar8 = iVar8 + uVar5;
          local_140 = local_140 + lVar49;
          local_148 = local_148 + lVar12;
          iVar28 = iVar28 + iVar3 * iVar1 * iVar2;
          iVar42 = iVar42 + iVar3 * iVar4 * iVar2;
        } while (uVar45 != uVar15);
      }
    }
    else if (1 < (int)uVar6) {
      local_1a0 = ch + (lVar11 + 3) * lVar20 + lVar13 + 1;
      local_168 = ch + (lVar11 + 2) * lVar20 + lVar13 + 1;
      local_1b0 = 0;
      uVar45 = 2;
      iVar1 = 0;
      do {
        if (2 < (int)uVar5) {
          lVar30 = 3;
          lVar13 = (long)iVar1;
          lVar22 = local_1b0;
          pdVar17 = local_1a0;
          pdVar23 = local_168;
          do {
            if (0 < (int)uVar7) {
              lVar41 = 0;
              lVar52 = lVar22;
              lVar14 = (ulong)(uVar7 + 1) - 1;
              do {
                *(double *)((long)c1 + lVar52 + lVar38 * 8 + (lVar11 + 2) * lVar29 * 8 + 8) =
                     wa[lVar13] * *(double *)((long)pdVar23 + lVar41) -
                     *(double *)((long)pdVar17 + lVar41) * wa[lVar13 + 1];
                *(double *)((long)c1 + lVar52 + lVar38 * 8 + (lVar11 + 3) * lVar29 * 8 + 8) =
                     wa[lVar13] * *(double *)((long)pdVar17 + lVar41) +
                     wa[lVar13 + 1] * *(double *)((long)pdVar23 + lVar41);
                lVar52 = lVar52 + lVar19 * 8;
                lVar41 = lVar41 + lVar36 * 8;
                lVar14 = lVar14 + -1;
              } while (lVar14 != 0);
            }
            lVar30 = lVar30 + 2;
            lVar22 = lVar22 + lVar29 * 0x10;
            pdVar17 = pdVar17 + lVar20 * 2;
            pdVar23 = pdVar23 + lVar20 * 2;
            lVar13 = lVar13 + 2;
          } while (lVar30 <= lVar21);
        }
        uVar45 = uVar45 + 1;
        iVar1 = iVar1 + uVar5;
        local_1b0 = local_1b0 + lVar49 * 8;
        local_1a0 = local_1a0 + lVar12;
        local_168 = local_168 + lVar12;
      } while (uVar45 != uVar15);
    }
  }
  return 0;
}

Assistant:

int r1fgkb_(int *ido, int *ip, int *l1, int *
	idl1, fft_real_t *cc, fft_real_t *c1, fft_real_t *c2, int *in1, fft_real_t *ch, fft_real_t *ch2,
	 int *in2, fft_real_t *wa)
{
    /* System generated locals */
    int ch_dim1, ch_dim2, ch_dim3, ch_offset, cc_dim1, cc_dim2, cc_dim3,
	    cc_offset, c1_dim1, c1_dim2, c1_dim3, c1_offset, c2_dim1, c2_dim2,
	     c2_offset, ch2_dim1, ch2_dim2, ch2_offset, i__1, i__2, i__3;

    /* Builtin functions */

    /* Local variables */
     int i__, j, k, l, j2, ic, jc, lc, ik, is;
     fft_real_t dc2, ai1, ai2, ar1, ar2, ds2;
     int nbd;
     fft_real_t dcp, arg, dsp, tpi, ar1h, ar2h;
     int idp2, ipp2, idij, ipph;


    /* Parameter adjustments */
    --wa;
    c2_dim1 = *in1;
    c2_dim2 = *idl1;
    c2_offset = 1 + c2_dim1 * (1 + c2_dim2);
    c2 -= c2_offset;
    c1_dim1 = *in1;
    c1_dim2 = *ido;
    c1_dim3 = *l1;
    c1_offset = 1 + c1_dim1 * (1 + c1_dim2 * (1 + c1_dim3));
    c1 -= c1_offset;
    cc_dim1 = *in1;
    cc_dim2 = *ido;
    cc_dim3 = *ip;
    cc_offset = 1 + cc_dim1 * (1 + cc_dim2 * (1 + cc_dim3));
    cc -= cc_offset;
    ch2_dim1 = *in2;
    ch2_dim2 = *idl1;
    ch2_offset = 1 + ch2_dim1 * (1 + ch2_dim2);
    ch2 -= ch2_offset;
    ch_dim1 = *in2;
    ch_dim2 = *ido;
    ch_dim3 = *l1;
    ch_offset = 1 + ch_dim1 * (1 + ch_dim2 * (1 + ch_dim3));
    ch -= ch_offset;

    /* Function Body */
    tpi = atan(1.0) * 8.0;
    arg = tpi / (fft_real_t) (*ip);
    dcp = cos(arg);
    dsp = sin(arg);
    idp2 = *ido + 2;
    nbd = (*ido - 1) / 2;
    ipp2 = *ip + 2;
    ipph = (*ip + 1) / 2;
    if (*ido < *l1) {
	goto L103;
    }
    i__1 = *l1;
    for (k = 1; k <= i__1; ++k) {
	i__2 = *ido;
	for (i__ = 1; i__ <= i__2; ++i__) {
	    ch[(i__ + (k + ch_dim3) * ch_dim2) * ch_dim1 + 1] = cc[(i__ + (k *
		     cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1];
/* L101: */
	}
/* L102: */
    }
    goto L106;
L103:
    i__1 = *ido;
    for (i__ = 1; i__ <= i__1; ++i__) {
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    ch[(i__ + (k + ch_dim3) * ch_dim2) * ch_dim1 + 1] = cc[(i__ + (k *
		     cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1];
/* L104: */
	}
/* L105: */
    }
L106:
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	j2 = j + j;
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    ch[((k + j * ch_dim3) * ch_dim2 + 1) * ch_dim1 + 1] = cc[(*ido + (
		    j2 - 2 + k * cc_dim3) * cc_dim2) * cc_dim1 + 1] + cc[(*
		    ido + (j2 - 2 + k * cc_dim3) * cc_dim2) * cc_dim1 + 1];
	    ch[((k + jc * ch_dim3) * ch_dim2 + 1) * ch_dim1 + 1] = cc[((j2 -
		    1 + k * cc_dim3) * cc_dim2 + 1) * cc_dim1 + 1] + cc[((j2
		    - 1 + k * cc_dim3) * cc_dim2 + 1) * cc_dim1 + 1];
/* L1007: */
/* L107: */
	}
/* L108: */
    }
    if (*ido == 1) {
	goto L116;
    }
    if (nbd < *l1) {
	goto L112;
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    i__3 = *ido;
	    for (i__ = 3; i__ <= i__3; i__ += 2) {
		ic = idp2 - i__;
		ch[(i__ - 1 + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1] =
			cc[(i__ - 1 + ((j << 1) - 1 + k * cc_dim3) * cc_dim2)
			* cc_dim1 + 1] + cc[(ic - 1 + ((j << 1) - 2 + k *
			cc_dim3) * cc_dim2) * cc_dim1 + 1];
		ch[(i__ - 1 + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 + 1] =
			cc[(i__ - 1 + ((j << 1) - 1 + k * cc_dim3) * cc_dim2)
			* cc_dim1 + 1] - cc[(ic - 1 + ((j << 1) - 2 + k *
			cc_dim3) * cc_dim2) * cc_dim1 + 1];
		ch[(i__ + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1] = cc[(
			i__ + ((j << 1) - 1 + k * cc_dim3) * cc_dim2) *
			cc_dim1 + 1] - cc[(ic + ((j << 1) - 2 + k * cc_dim3) *
			 cc_dim2) * cc_dim1 + 1];
		ch[(i__ + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 + 1] = cc[(
			i__ + ((j << 1) - 1 + k * cc_dim3) * cc_dim2) *
			cc_dim1 + 1] + cc[(ic + ((j << 1) - 2 + k * cc_dim3) *
			 cc_dim2) * cc_dim1 + 1];
/* L109: */
	    }
/* L110: */
	}
/* L111: */
    }
    goto L116;
L112:
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	i__2 = *ido;
	for (i__ = 3; i__ <= i__2; i__ += 2) {
	    ic = idp2 - i__;
	    i__3 = *l1;
	    for (k = 1; k <= i__3; ++k) {
		ch[(i__ - 1 + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1] =
			cc[(i__ - 1 + ((j << 1) - 1 + k * cc_dim3) * cc_dim2)
			* cc_dim1 + 1] + cc[(ic - 1 + ((j << 1) - 2 + k *
			cc_dim3) * cc_dim2) * cc_dim1 + 1];
		ch[(i__ - 1 + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 + 1] =
			cc[(i__ - 1 + ((j << 1) - 1 + k * cc_dim3) * cc_dim2)
			* cc_dim1 + 1] - cc[(ic - 1 + ((j << 1) - 2 + k *
			cc_dim3) * cc_dim2) * cc_dim1 + 1];
		ch[(i__ + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1] = cc[(
			i__ + ((j << 1) - 1 + k * cc_dim3) * cc_dim2) *
			cc_dim1 + 1] - cc[(ic + ((j << 1) - 2 + k * cc_dim3) *
			 cc_dim2) * cc_dim1 + 1];
		ch[(i__ + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 + 1] = cc[(
			i__ + ((j << 1) - 1 + k * cc_dim3) * cc_dim2) *
			cc_dim1 + 1] + cc[(ic + ((j << 1) - 2 + k * cc_dim3) *
			 cc_dim2) * cc_dim1 + 1];
/* L113: */
	    }
/* L114: */
	}
/* L115: */
    }
L116:
    ar1 = 1.0;
    ai1 = 0.0;
    i__1 = ipph;
    for (l = 2; l <= i__1; ++l) {
	lc = ipp2 - l;
	ar1h = dcp * ar1 - dsp * ai1;
	ai1 = dcp * ai1 + dsp * ar1;
	ar1 = ar1h;
	i__2 = *idl1;
	for (ik = 1; ik <= i__2; ++ik) {
	    c2[(ik + l * c2_dim2) * c2_dim1 + 1] = ch2[(ik + ch2_dim2) *
		    ch2_dim1 + 1] + ar1 * ch2[(ik + (ch2_dim2 << 1)) *
		    ch2_dim1 + 1];
	    c2[(ik + lc * c2_dim2) * c2_dim1 + 1] = ai1 * ch2[(ik + *ip *
		    ch2_dim2) * ch2_dim1 + 1];
/* L117: */
	}
	dc2 = ar1;
	ds2 = ai1;
	ar2 = ar1;
	ai2 = ai1;
	i__2 = ipph;
	for (j = 3; j <= i__2; ++j) {
	    jc = ipp2 - j;
	    ar2h = dc2 * ar2 - ds2 * ai2;
	    ai2 = dc2 * ai2 + ds2 * ar2;
	    ar2 = ar2h;
	    i__3 = *idl1;
	    for (ik = 1; ik <= i__3; ++ik) {
		c2[(ik + l * c2_dim2) * c2_dim1 + 1] += ar2 * ch2[(ik + j *
			ch2_dim2) * ch2_dim1 + 1];
		c2[(ik + lc * c2_dim2) * c2_dim1 + 1] += ai2 * ch2[(ik + jc *
			ch2_dim2) * ch2_dim1 + 1];
/* L118: */
	    }
/* L119: */
	}
/* L120: */
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	i__2 = *idl1;
	for (ik = 1; ik <= i__2; ++ik) {
	    ch2[(ik + ch2_dim2) * ch2_dim1 + 1] += ch2[(ik + j * ch2_dim2) *
		    ch2_dim1 + 1];
/* L121: */
	}
/* L122: */
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    ch[((k + j * ch_dim3) * ch_dim2 + 1) * ch_dim1 + 1] = c1[((k + j *
		     c1_dim3) * c1_dim2 + 1) * c1_dim1 + 1] - c1[((k + jc *
		    c1_dim3) * c1_dim2 + 1) * c1_dim1 + 1];
	    ch[((k + jc * ch_dim3) * ch_dim2 + 1) * ch_dim1 + 1] = c1[((k + j
		    * c1_dim3) * c1_dim2 + 1) * c1_dim1 + 1] + c1[((k + jc *
		    c1_dim3) * c1_dim2 + 1) * c1_dim1 + 1];
/* L123: */
	}
/* L124: */
    }
    if (*ido == 1) {
	goto L132;
    }
    if (nbd < *l1) {
	goto L128;
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    i__3 = *ido;
	    for (i__ = 3; i__ <= i__3; i__ += 2) {
		ch[(i__ - 1 + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1] =
			c1[(i__ - 1 + (k + j * c1_dim3) * c1_dim2) * c1_dim1
			+ 1] - c1[(i__ + (k + jc * c1_dim3) * c1_dim2) *
			c1_dim1 + 1];
		ch[(i__ - 1 + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 + 1] =
			c1[(i__ - 1 + (k + j * c1_dim3) * c1_dim2) * c1_dim1
			+ 1] + c1[(i__ + (k + jc * c1_dim3) * c1_dim2) *
			c1_dim1 + 1];
		ch[(i__ + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1] = c1[(
			i__ + (k + j * c1_dim3) * c1_dim2) * c1_dim1 + 1] +
			c1[(i__ - 1 + (k + jc * c1_dim3) * c1_dim2) * c1_dim1
			+ 1];
		ch[(i__ + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 + 1] = c1[(
			i__ + (k + j * c1_dim3) * c1_dim2) * c1_dim1 + 1] -
			c1[(i__ - 1 + (k + jc * c1_dim3) * c1_dim2) * c1_dim1
			+ 1];
/* L125: */
	    }
/* L126: */
	}
/* L127: */
    }
    goto L132;
L128:
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	i__2 = *ido;
	for (i__ = 3; i__ <= i__2; i__ += 2) {
	    i__3 = *l1;
	    for (k = 1; k <= i__3; ++k) {
		ch[(i__ - 1 + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1] =
			c1[(i__ - 1 + (k + j * c1_dim3) * c1_dim2) * c1_dim1
			+ 1] - c1[(i__ + (k + jc * c1_dim3) * c1_dim2) *
			c1_dim1 + 1];
		ch[(i__ - 1 + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 + 1] =
			c1[(i__ - 1 + (k + j * c1_dim3) * c1_dim2) * c1_dim1
			+ 1] + c1[(i__ + (k + jc * c1_dim3) * c1_dim2) *
			c1_dim1 + 1];
		ch[(i__ + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1] = c1[(
			i__ + (k + j * c1_dim3) * c1_dim2) * c1_dim1 + 1] +
			c1[(i__ - 1 + (k + jc * c1_dim3) * c1_dim2) * c1_dim1
			+ 1];
		ch[(i__ + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 + 1] = c1[(
			i__ + (k + j * c1_dim3) * c1_dim2) * c1_dim1 + 1] -
			c1[(i__ - 1 + (k + jc * c1_dim3) * c1_dim2) * c1_dim1
			+ 1];
/* L129: */
	    }
/* L130: */
	}
/* L131: */
    }
L132:
    if (*ido == 1) {
	return 0;
    }
    i__1 = *idl1;
    for (ik = 1; ik <= i__1; ++ik) {
	c2[(ik + c2_dim2) * c2_dim1 + 1] = ch2[(ik + ch2_dim2) * ch2_dim1 + 1]
		;
/* L133: */
    }
    i__1 = *ip;
    for (j = 2; j <= i__1; ++j) {
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    c1[((k + j * c1_dim3) * c1_dim2 + 1) * c1_dim1 + 1] = ch[((k + j *
		     ch_dim3) * ch_dim2 + 1) * ch_dim1 + 1];
/* L134: */
	}
/* L135: */
    }
    if (nbd > *l1) {
	goto L139;
    }
    is = -(*ido);
    i__1 = *ip;
    for (j = 2; j <= i__1; ++j) {
	is += *ido;
	idij = is;
	i__2 = *ido;
	for (i__ = 3; i__ <= i__2; i__ += 2) {
	    idij += 2;
	    i__3 = *l1;
	    for (k = 1; k <= i__3; ++k) {
		c1[(i__ - 1 + (k + j * c1_dim3) * c1_dim2) * c1_dim1 + 1] =
			wa[idij - 1] * ch[(i__ - 1 + (k + j * ch_dim3) *
			ch_dim2) * ch_dim1 + 1] - wa[idij] * ch[(i__ + (k + j
			* ch_dim3) * ch_dim2) * ch_dim1 + 1];
		c1[(i__ + (k + j * c1_dim3) * c1_dim2) * c1_dim1 + 1] = wa[
			idij - 1] * ch[(i__ + (k + j * ch_dim3) * ch_dim2) *
			ch_dim1 + 1] + wa[idij] * ch[(i__ - 1 + (k + j *
			ch_dim3) * ch_dim2) * ch_dim1 + 1];
/* L136: */
	    }
/* L137: */
	}
/* L138: */
    }
    goto L143;
L139:
    is = -(*ido);
    i__1 = *ip;
    for (j = 2; j <= i__1; ++j) {
	is += *ido;
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    idij = is;
	    i__3 = *ido;
	    for (i__ = 3; i__ <= i__3; i__ += 2) {
		idij += 2;
		c1[(i__ - 1 + (k + j * c1_dim3) * c1_dim2) * c1_dim1 + 1] =
			wa[idij - 1] * ch[(i__ - 1 + (k + j * ch_dim3) *
			ch_dim2) * ch_dim1 + 1] - wa[idij] * ch[(i__ + (k + j
			* ch_dim3) * ch_dim2) * ch_dim1 + 1];
		c1[(i__ + (k + j * c1_dim3) * c1_dim2) * c1_dim1 + 1] = wa[
			idij - 1] * ch[(i__ + (k + j * ch_dim3) * ch_dim2) *
			ch_dim1 + 1] + wa[idij] * ch[(i__ - 1 + (k + j *
			ch_dim3) * ch_dim2) * ch_dim1 + 1];
/* L140: */
	    }
/* L141: */
	}
/* L142: */
    }
L143:
    return 0;
}